

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# irrArray.h
# Opt level: O2

void __thiscall
irr::core::array<irr::io::CXMLReaderImpl<unsigned_short,_irr::io::IXMLBase>::SAttribute>::clear
          (array<irr::io::CXMLReaderImpl<unsigned_short,_irr::io::IXMLBase>::SAttribute> *this)

{
  SAttribute *pSVar1;
  long lVar2;
  long lVar3;
  
  pSVar1 = this->data;
  if (pSVar1 != (SAttribute *)0x0) {
    lVar2._0_4_ = pSVar1[-1].Value.allocated;
    lVar2._4_4_ = pSVar1[-1].Value.used;
    if (lVar2 != 0) {
      lVar3 = lVar2 << 5;
      do {
        io::CXMLReaderImpl<unsigned_short,_irr::io::IXMLBase>::SAttribute::~SAttribute
                  ((SAttribute *)((long)&pSVar1[-1].Name.array + lVar3));
        lVar3 = lVar3 + -0x20;
      } while (lVar3 != 0);
    }
    operator_delete__(&pSVar1[-1].Value.allocated,lVar2 << 5 | 8);
  }
  this->data = (SAttribute *)0x0;
  this->allocated = 0;
  this->used = 0;
  this->is_sorted = true;
  return;
}

Assistant:

void clear()
	{
		delete [] data;
		data = 0;
		used = 0;
		allocated = 0;
		is_sorted = true;
	}